

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_query.hpp
# Opt level: O2

type jsoncons::jsonpath::
     json_replace<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,double>
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *root,
               string_view_type *path,double *new_value,
               custom_functions<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
               *funcs)

{
  __single_object resources;
  path_expression_type expr;
  path_node_type local_178;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  context;
  evaluator_type evaluator;
  
  std::
  make_unique<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,jsoncons::jsonpath::custom_functions<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&>
            ((custom_functions<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)&resources);
  evaluator.super_ser_context._vptr_ser_context = (_func_int **)&PTR__jsonpath_evaluator_009a08d0;
  evaluator.line_ = 1;
  evaluator.column_ = 1;
  evaluator.begin_input_ = (char_type *)0x0;
  evaluator.end_input_ = (char_type *)0x0;
  evaluator.p_ = (char_type *)0x0;
  evaluator.function_stack_.
  super__Vector_base<std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*>_>,_std::allocator<std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  evaluator.function_stack_.
  super__Vector_base<std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*>_>,_std::allocator<std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  evaluator.function_stack_.
  super__Vector_base<std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*>_>,_std::allocator<std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  evaluator.state_stack_.
  super__Vector_base<jsoncons::jsonpath::detail::path_state,_std::allocator<jsoncons::jsonpath::detail::path_state>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  evaluator.state_stack_.
  super__Vector_base<jsoncons::jsonpath::detail::path_state,_std::allocator<jsoncons::jsonpath::detail::path_state>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  evaluator.state_stack_.
  super__Vector_base<jsoncons::jsonpath::detail::path_state,_std::allocator<jsoncons::jsonpath::detail::path_state>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  evaluator.output_stack_.
  super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  evaluator.output_stack_.
  super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  evaluator.output_stack_.
  super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  evaluator.operator_stack_.
  super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  evaluator.operator_stack_.
  super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  evaluator.operator_stack_.
  super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  detail::
  jsonpath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  ::compile(&expr,&evaluator,
            (static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
             *)resources._M_t.
               super___uniq_ptr_impl<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               .
               super__Head_base<0UL,_jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
               ._M_head_impl,path);
  detail::
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  ::eval_context(&context,(allocator_type *)&local_178);
  local_178.parent_ = (basic_path_node<char> *)0x0;
  local_178.size_ = 1;
  local_178.node_kind_ = root;
  local_178.name_._M_len = 0;
  local_178.name_._M_str = (char *)0x0;
  local_178.index_ = 0;
  detail::
  path_expression<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
  ::
  evaluate<jsoncons::jsonpath::json_replace<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,double>(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::string_view_type_const&,double&&,jsoncons::jsonpath::custom_functions<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>const&)::_lambda(jsoncons::jsonpath::basic_path_node<char>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&)_1_>
            ((path_expression<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
              *)&expr,&context,root,&local_178,root,(anon_class_8_1_06a56cb2)new_value,
             path|sort_descending|nodups);
  detail::
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  ::~eval_context(&context);
  detail::
  jsonpath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  ::~jsonpath_evaluator(&evaluator);
  std::
  unique_ptr<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonpath::detail::static_resources<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  ::~unique_ptr(&resources);
  return;
}

Assistant:

typename std::enable_if<is_json_type_traits_specialized<Json,T>::value,void>::type
        json_replace(Json& root, const typename Json::string_view_type& path, T&& new_value,
                     const custom_functions<Json>& funcs = custom_functions<Json>())
    {
        using jsonpath_traits_type = jsoncons::jsonpath::legacy_jsonpath_traits<Json, Json&>;

        using value_type = typename jsonpath_traits_type::value_type;
        using reference = typename jsonpath_traits_type::reference;
        using evaluator_type = typename jsonpath_traits_type::evaluator_type;
        using path_expression_type = typename jsonpath_traits_type::path_expression_type;
        using path_node_type = typename jsonpath_traits_type::path_node_type;

        auto resources = jsoncons::make_unique<jsoncons::jsonpath::detail::static_resources<value_type>>(funcs);
        evaluator_type evaluator;
        path_expression_type expr = evaluator.compile(*resources, path);

        jsoncons::jsonpath::detail::eval_context<Json,reference> context;
        auto callback = [&new_value](const path_node_type&, reference v)
        {
            v = std::forward<T>(new_value);
        };

        result_options options = result_options::nodups | result_options::path | result_options::sort_descending;
        expr.evaluate(context, root, path_node_type{}, root, callback, options);
    }